

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDocument.cpp
# Opt level: O2

BreakpointProbe * __thiscall
Js::DebugDocument::FindBreakpoint(DebugDocument *this,StatementLocation statement)

{
  BreakpointProbeList *pBVar1;
  BreakpointProbe *this_00;
  StatementLocation statement_00;
  undefined8 uVar2;
  bool bVar3;
  int i;
  long lVar4;
  Interval in_stack_ffffffffffffffd0;
  
  pBVar1 = this->m_breakpointList;
  if (pBVar1 != (BreakpointProbeList *)0x0) {
    for (lVar4 = 0;
        lVar4 < (pBVar1->
                super_ReadOnlyList<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_DefaultComparer>).
                count; lVar4 = lVar4 + 1) {
      this_00 = (pBVar1->
                super_ReadOnlyList<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_DefaultComparer>).
                buffer[lVar4];
      if ((this_00 != (BreakpointProbe *)0x0) &&
         (statement_00.bytecodeSpan = in_stack_ffffffffffffffd0, uVar2 = SUB168(statement._8_16_,8),
         statement_00.function = (FunctionBody *)SUB168(statement._8_16_,0),
         statement_00.statement.begin = (int)uVar2,
         statement_00.statement.end = (int)((ulong)uVar2 >> 0x20),
         bVar3 = BreakpointProbe::Matches(this_00,statement_00), bVar3)) {
        return this_00;
      }
    }
  }
  return (BreakpointProbe *)0x0;
}

Assistant:

Js::BreakpointProbe* DebugDocument::FindBreakpoint(StatementLocation statement)
    {
        Js::BreakpointProbe* probe = nullptr;
        if (m_breakpointList != nullptr)
        {
            m_breakpointList->MapUntil([&](int index, BreakpointProbe* bpProbe) -> bool
            {
                if (bpProbe != nullptr && bpProbe->Matches(statement))
                {
                    probe = bpProbe;
                    return true;
                }
                return false;
            });
        }

        return probe;
    }